

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_thread.c
# Opt level: O3

int nni_plat_init(nng_init_params *params)

{
  int iVar1;
  int iVar2;
  
  iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&nni_mxattr);
  iVar2 = 2;
  if (((iVar1 == 0) &&
      (iVar1 = pthread_condattr_init((pthread_condattr_t *)&nni_cvattr), iVar1 == 0)) &&
     (iVar1 = pthread_attr_init((pthread_attr_t *)&nni_thrattr), iVar1 == 0)) {
    iVar1 = pthread_condattr_setclock((pthread_condattr_t *)&nni_cvattr,1);
    if (iVar1 == 0) {
      pthread_mutexattr_settype((pthread_mutexattr_t *)&nni_mxattr,2);
      iVar2 = nni_posix_pollq_sysinit(params);
      if (iVar2 == 0) {
        iVar2 = nni_posix_resolv_sysinit(params);
        if (iVar2 == 0) {
          nni_plat_inited = 1;
          pthread_atfork((__prepare *)0x0,(__parent *)0x0,nni_atfork_child);
          return 0;
        }
        nni_posix_pollq_sysfini();
      }
    }
    nni_plat_fini();
  }
  return iVar2;
}

Assistant:

int
nni_plat_init(nng_init_params *params)
{
	int rv;

	if ((pthread_mutexattr_init(&nni_mxattr) != 0) ||
	    (pthread_condattr_init(&nni_cvattr) != 0) ||
	    (pthread_attr_init(&nni_thrattr) != 0)) {
		// Technically this is leaking, but it should never
		// occur, so really not worried about it.
		return (NNG_ENOMEM);
	}

#if !defined(NNG_USE_GETTIMEOFDAY) && NNG_USE_CLOCKID != CLOCK_REALTIME
	if (pthread_condattr_setclock(&nni_cvattr, NNG_USE_CLOCKID) != 0) {
		nni_plat_fini();
		return (NNG_ENOMEM);
	}
#endif

#if defined(NNG_SETSTACKSIZE)
	struct rlimit rl;
	if ((getrlimit(RLIMIT_STACK, &rl) == 0) &&
	    (rl.rlim_cur != RLIM_INFINITY) &&
	    (rl.rlim_cur >= PTHREAD_STACK_MIN) &&
	    (pthread_attr_setstacksize(&nni_thrattr, rl.rlim_cur) != 0)) {
		nni_plat_fini();
		return (NNG_ENOMEM);
	}
#endif

	// if this one fails we don't care.
	(void) pthread_mutexattr_settype(
	    &nni_mxattr, PTHREAD_MUTEX_ERRORCHECK);

	if ((rv = nni_posix_pollq_sysinit(params)) != 0) {
		nni_plat_fini();
		return (rv);
	}

	if ((rv = nni_posix_resolv_sysinit(params)) != 0) {
		nni_posix_pollq_sysfini();
		nni_plat_fini();
		return (rv);
	}

	nni_plat_inited = true;

	// if this fails, its not critical, but it means the user won't get the
	// benefit of checking for incorrect use-after-fork-in-child behavior.
	// Since that only can occur if the application developer has made a
	// gross mistake, and the consequence of that will be a panic anyway,
	// we just ignore this error.
	(void) pthread_atfork(NULL, NULL, nni_atfork_child);

	return (rv);
}